

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,Interval *iarg0)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  deRoundingMode dVar4;
  uint uVar5;
  undefined1 uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_c8;
  double dStack_c0;
  uint local_b0 [2];
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  Interval *local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  Interval local_48;
  
  local_48.m_hasNaN = false;
  local_c8 = INFINITY;
  dStack_c0 = -INFINITY;
  local_48.m_lo = INFINITY;
  local_48.m_hi = -INFINITY;
  dVar11 = iarg0->m_lo;
  if (dVar11 < iarg0->m_hi || dVar11 == iarg0->m_hi) {
    dVar4 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b0,this,ctx);
    bVar1 = (byte)local_b0[0];
    local_58 = local_a8;
    dStack_50 = dStack_a0;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b0,this,ctx);
    bVar2 = (byte)local_b0[0];
    local_68 = local_a8;
    dStack_60 = dStack_a0;
    deSetRoundingMode(dVar4);
    dVar11 = iarg0->m_hi;
    dVar4 = deGetRoundingMode();
    local_98 = (double)CONCAT44(local_98._4_4_,dVar4);
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    local_80 = __return_storage_ptr__;
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b0,this,ctx);
    uVar3 = local_b0[0];
    local_78 = local_a8;
    dStack_70 = dStack_a0;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(dVar11,local_b0,this,ctx);
    dVar12 = dStack_a0;
    dVar11 = local_a8;
    uVar5 = local_b0[0];
    deSetRoundingMode(local_98._0_4_);
    dVar9 = (double)(~-(ulong)(local_58 <= local_68) & (ulong)local_68 |
                    (ulong)local_58 & -(ulong)(local_58 <= local_68));
    dVar10 = (double)(~-(ulong)(dStack_60 <= dStack_50) & (ulong)dStack_60 |
                     (ulong)dStack_50 & -(ulong)(dStack_60 <= dStack_50));
    uVar5 = uVar5 & 0xff;
    if ((uVar3 & 1) != 0) {
      uVar5 = 1;
    }
    if (((bVar1 | bVar2) & 1) != 0) {
      uVar5 = 1;
    }
    uVar7 = -(ulong)(local_78 <= dVar11);
    uVar8 = -(ulong)(dVar12 <= dStack_70);
    dVar11 = (double)(~uVar7 & (ulong)dVar11 | (ulong)local_78 & uVar7);
    dVar12 = (double)(~uVar8 & (ulong)dVar12 | (ulong)dStack_70 & uVar8);
    uVar7 = -(ulong)(dVar9 <= dVar11);
    uVar8 = -(ulong)(dVar12 <= dVar10);
    local_c8 = (double)(~uVar7 & (ulong)dVar11 | (ulong)dVar9 & uVar7);
    dStack_c0 = (double)(~uVar8 & (ulong)dVar12 | (ulong)dVar10 & uVar8);
    __return_storage_ptr__ = local_80;
  }
  else {
    uVar5 = 0;
  }
  if (iarg0->m_hasNaN == true) {
    local_c8 = (double)((ulong)local_c8 & -(ulong)(local_c8 <= INFINITY) |
                       ~-(ulong)(local_c8 <= INFINITY) & 0x7ff0000000000000);
    dStack_c0 = (double)((ulong)dStack_c0 & -(ulong)(-INFINITY <= dStack_c0) |
                        ~-(ulong)(-INFINITY <= dStack_c0) & 0xfff0000000000000);
    uVar5 = 1;
  }
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(local_b0,this,ctx,iarg0);
  uVar6 = 1;
  if ((uVar5 & 1) == 0) {
    uVar6 = (byte)local_b0[0];
  }
  local_98 = (double)(~-(ulong)(local_c8 <= local_a8) & (ulong)local_a8 |
                     -(ulong)(local_c8 <= local_a8) & (ulong)local_c8);
  dStack_90 = dStack_c0;
  dVar11 = (double)(~-(ulong)(dStack_a0 <= dStack_c0) & (ulong)dStack_a0 |
                   (ulong)dStack_c0 & -(ulong)(dStack_a0 <= dStack_c0));
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(local_b0,this);
  if (INFINITY <= local_a8) {
    local_a8 = INFINITY;
  }
  if (dStack_a0 <= -INFINITY) {
    dStack_a0 = -INFINITY;
  }
  local_48.m_lo =
       (double)(~-(ulong)(local_a8 <= local_98) & (ulong)local_a8 |
               -(ulong)(local_a8 <= local_98) & (ulong)local_98);
  uVar7 = -(ulong)(dVar11 <= dStack_a0);
  local_48.m_hi = (double)(~uVar7 & (ulong)dStack_a0 | uVar7 & (ulong)dVar11);
  local_48.m_hasNaN = (bool)uVar6;
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext& ctx, const Interval& iarg0) const
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE1(ret, arg0, iarg0, val,
									 TCU_SET_INTERVAL(val, point,
													  point = this->applyPoint(ctx, arg0)));

		ret |= innerExtrema(ctx, iarg0);
		ret &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(ret);
	}